

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_mwhere(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  BUFFER *pBVar5;
  char *pcVar6;
  char *pcVar7;
  char *in_RSI;
  DESCRIPTOR_DATA *d;
  int count;
  bool found;
  CHAR_DATA *victim;
  BUFFER *buffer;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffed48;
  char *in_stack_ffffffffffffed50;
  CHAR_DATA *in_stack_ffffffffffffed58;
  undefined4 in_stack_ffffffffffffed60;
  uint in_stack_ffffffffffffed64;
  CHAR_DATA *in_stack_ffffffffffffed68;
  uint local_128c;
  char *local_1270;
  DESCRIPTOR_DATA *local_1238;
  uint local_1230;
  CHAR_DATA *local_1228;
  char local_1218 [4632];
  
  local_1230 = 0;
  if (*in_RSI == '\0') {
    pBVar5 = new_buf();
    for (local_1238 = descriptor_list; local_1238 != (DESCRIPTOR_DATA *)0x0;
        local_1238 = local_1238->next) {
      if (((local_1238->character != (CHAR_DATA *)0x0) && (local_1238->connected == 0)) &&
         ((local_1238->character->in_room != (ROOM_INDEX_DATA *)0x0 &&
          ((bVar3 = can_see(in_stack_ffffffffffffed68,
                            (CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60)), bVar3 &&
           (bVar3 = can_see_room(in_stack_ffffffffffffed68,
                                 (ROOM_INDEX_DATA *)
                                 CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60)),
           bVar3)))))) {
        pCVar1 = local_1238->character;
        local_1230 = local_1230 + 1;
        if (local_1238->original == (CHAR_DATA *)0x0) {
          bVar3 = is_npc(in_stack_ffffffffffffed48);
          if (bVar3) {
            local_1270 = pCVar1->name;
          }
          else {
            local_1270 = pCVar1->true_name;
          }
          pcVar7 = get_room_name((ROOM_INDEX_DATA *)in_stack_ffffffffffffed48);
          sprintf(local_1218,"%3d) %s is in %s [%d]\n\r",(ulong)local_1230,local_1270,pcVar7,
                  (ulong)(uint)(int)pCVar1->in_room->vnum);
        }
        else {
          pcVar7 = local_1238->original->true_name;
          pcVar2 = pCVar1->short_descr;
          pcVar6 = get_room_name((ROOM_INDEX_DATA *)in_stack_ffffffffffffed48);
          in_stack_ffffffffffffed48 =
               (CHAR_DATA *)
               CONCAT44((int)((ulong)in_stack_ffffffffffffed48 >> 0x20),(int)pCVar1->in_room->vnum);
          sprintf(local_1218,"%3d) %s (in the body of %s) is in %s [%d]\n\r",(ulong)local_1230,
                  pcVar7,pcVar2,pcVar6);
        }
        add_buf((BUFFER *)in_stack_ffffffffffffed68,
                (char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
      }
    }
    buf_string(pBVar5);
    page_to_char(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
    free_buf((BUFFER *)0x591ca5);
  }
  else {
    bVar3 = false;
    pBVar5 = new_buf();
    for (local_1228 = char_list; local_1228 != (CHAR_DATA *)0x0; local_1228 = local_1228->next) {
      if (((local_1228->in_room != (ROOM_INDEX_DATA *)0x0) &&
          (bVar4 = can_see(in_stack_ffffffffffffed68,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60)), bVar4))
         && (bVar4 = is_name((char *)buf._4280_8_,(char *)buf._4272_8_), bVar4)) {
        bVar3 = true;
        local_1230 = local_1230 + 1;
        bVar4 = is_npc(in_stack_ffffffffffffed48);
        if (bVar4) {
          local_128c = (uint)local_1228->pIndexData->vnum;
        }
        else {
          local_128c = 0;
        }
        bVar4 = is_npc(in_stack_ffffffffffffed48);
        if (bVar4) {
          in_stack_ffffffffffffed58 = (CHAR_DATA *)local_1228->short_descr;
        }
        else {
          in_stack_ffffffffffffed58 = (CHAR_DATA *)local_1228->name;
        }
        in_stack_ffffffffffffed64 = (uint)local_1228->in_room->vnum;
        in_stack_ffffffffffffed68 = in_stack_ffffffffffffed58;
        in_stack_ffffffffffffed48 =
             (CHAR_DATA *)get_room_name((ROOM_INDEX_DATA *)in_stack_ffffffffffffed48);
        sprintf(local_1218,"%3d) [%5d] %-28s [%5d] %s\n\r",(ulong)local_1230,(ulong)local_128c,
                in_stack_ffffffffffffed58,(ulong)in_stack_ffffffffffffed64);
        add_buf((BUFFER *)in_stack_ffffffffffffed68,
                (char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
      }
    }
    if (bVar3) {
      buf_string(pBVar5);
      page_to_char(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
    }
    else {
      act((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
          in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,0);
    }
    free_buf((BUFFER *)0x591ecc);
  }
  return;
}

Assistant:

void do_mwhere(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	BUFFER *buffer;
	CHAR_DATA *victim;
	bool found;
	int count = 0;

	if (argument[0] == '\0')
	{
		DESCRIPTOR_DATA *d;

		/* show characters logged */

		buffer = new_buf();
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->character != nullptr
				&& d->connected == CON_PLAYING
				&& d->character->in_room != nullptr
				&& can_see(ch, d->character)
				&& can_see_room(ch, d->character->in_room))
			{
				victim = d->character;
				count++;

				if (d->original != nullptr)
				{
					sprintf(buf, "%3d) %s (in the body of %s) is in %s [%d]\n\r",
						count,
						d->original->true_name,
						victim->short_descr,
						get_room_name(victim->in_room),
						victim->in_room->vnum);
				}
				else
				{
					sprintf(buf, "%3d) %s is in %s [%d]\n\r",
						count,
						is_npc(victim) ? victim->name : victim->true_name,
						get_room_name(victim->in_room),
						victim->in_room->vnum);
				}

				add_buf(buffer, buf);
			}
		}

		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
		return;
	}

	found = false;
	buffer = new_buf();

	for (victim = char_list; victim != nullptr; victim = victim->next)
	{
		if (victim->in_room != nullptr && can_see(ch, victim) && is_name(argument, victim->name))
		{
			found = true;
			count++;

			sprintf(buf, "%3d) [%5d] %-28s [%5d] %s\n\r",
				count,
				is_npc(victim) ? victim->pIndexData->vnum : 0,
				is_npc(victim) ? victim->short_descr : victim->name,
				victim->in_room->vnum,
				get_room_name(victim->in_room));
			add_buf(buffer, buf);
		}
	}

	if (!found)
		act("You didn't find any $T.", ch, nullptr, argument, TO_CHAR);
	else
		page_to_char(buf_string(buffer), ch);

	free_buf(buffer);
}